

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::addRenderTest
          (anon_unknown_0 *this,TestCaseGroup *group,string *namePrefix,string *descPrefix,
          int numIterations,ParamFlags flags,TestParams params)

{
  Context *ctx;
  bool bVar1;
  undefined1 uVar2;
  SeparateShaderTest *this_00;
  char *pcVar3;
  string local_358;
  string local_338;
  ostringstream name;
  ostringstream desc;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
  std::operator<<(&name.super_basic_ostream<char,_std::char_traits<char>_>,(string *)group);
  std::operator<<(&desc.super_basic_ostream<char,_std::char_traits<char>_>,(string *)namePrefix);
  params.switchVtx = (bool)((byte)(((ulong)descPrefix & 0xffffffff) >> 1) & 1);
  params.switchFrg = (bool)((byte)descPrefix & 1);
  params.initSingle = SUB41(((uint)descPrefix & 4) >> 2,0);
  pcVar3 = "single_program";
  if (((ulong)descPrefix & 4) == 0) {
    pcVar3 = "separate_programs";
  }
  std::operator<<(&name.super_basic_ostream<char,_std::char_traits<char>_>,pcVar3);
  pcVar3 = "Single program with two shaders";
  if (((ulong)descPrefix & 4) == 0) {
    pcVar3 = "Separate programs for each shader";
  }
  std::operator<<(&desc.super_basic_ostream<char,_std::char_traits<char>_>,pcVar3);
  switch((uint)descPrefix & 3) {
  case 0:
    goto switchD_01245171_caseD_0;
  case 1:
    std::operator<<(&name.super_basic_ostream<char,_std::char_traits<char>_>,"_add_fragment");
    pcVar3 = ", then add a fragment program";
    break;
  case 2:
    std::operator<<(&name.super_basic_ostream<char,_std::char_traits<char>_>,"_add_vertex");
    pcVar3 = ", then add a vertex program";
    break;
  case 3:
    std::operator<<(&name.super_basic_ostream<char,_std::char_traits<char>_>,"_add_both");
    pcVar3 = ", then add both vertex and shader programs";
  }
  std::operator<<(&desc.super_basic_ostream<char,_std::char_traits<char>_>,pcVar3);
switchD_01245171_caseD_0:
  bVar1 = paramsValid(&params);
  if (bVar1) {
    this_00 = (SeparateShaderTest *)operator_new(0x180);
    ctx = *(Context **)(this + 0x70);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    SeparateShaderTest::SeparateShaderTest(this_00,ctx,&local_338,&local_358,4,&params,0x1245472);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_338);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
  uVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  return (bool)uVar2;
}

Assistant:

bool addRenderTest (TestCaseGroup& group, const string& namePrefix, const string& descPrefix,
					int numIterations, ParamFlags flags, TestParams params)
{
	ostringstream	name;
	ostringstream	desc;

	DE_ASSERT(areCaseParamFlagsValid(flags));

	name << namePrefix;
	desc << descPrefix;

	params.initSingle	= (flags & PARAMFLAGS_INIT_SINGLE) != 0;
	params.switchVtx	= (flags & PARAMFLAGS_SWITCH_VERTEX) != 0;
	params.switchFrg	= (flags & PARAMFLAGS_SWITCH_FRAGMENT) != 0;

	name << (flags & PARAMFLAGS_INIT_SINGLE ? "single_program" : "separate_programs");
	desc << (flags & PARAMFLAGS_INIT_SINGLE
			 ? "Single program with two shaders"
			 : "Separate programs for each shader");

	switch (flags & (PARAMFLAGS_SWITCH_FRAGMENT | PARAMFLAGS_SWITCH_VERTEX))
	{
		case 0:
			break;
		case PARAMFLAGS_SWITCH_FRAGMENT:
			name << "_add_fragment";
			desc << ", then add a fragment program";
			break;
		case PARAMFLAGS_SWITCH_VERTEX:
			name << "_add_vertex";
			desc << ", then add a vertex program";
			break;
		case PARAMFLAGS_SWITCH_FRAGMENT | PARAMFLAGS_SWITCH_VERTEX:
			name << "_add_both";
			desc << ", then add both vertex and shader programs";
			break;
	}

	if (!paramsValid(params))
		return false;

	group.addChild(new SeparateShaderTest(group.getContext(), name.str(), desc.str(),
										  numIterations, params,
										  &SeparateShaderTest::testPipelineRendering));

	return true;
}